

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
          (ServiceDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint8 *puVar3;
  Container *target_00;
  undefined8 in_RDX;
  EpsCopyOutputStream *in_RSI;
  EpsCopyOutputStream *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_fffffffffffffef8;
  EpsCopyOutputStream *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint uVar4;
  uint uVar5;
  EpsCopyOutputStream *in_stack_ffffffffffffff40;
  uint8 *in_stack_ffffffffffffff48;
  EpsCopyOutputStream *stream_00;
  MethodDescriptorProto *in_stack_ffffffffffffff50;
  InternalMetadataWithArena *pIVar6;
  
  uVar2 = (uint32)((ulong)in_RDX >> 0x20);
  uVar5 = ((HasBits<1UL> *)in_RDI->buffer_)->has_bits_[0];
  if ((uVar5 & 1) != 0) {
    _internal_name_abi_cxx11_((ServiceDescriptorProto *)0x5025c0);
    in_stack_ffffffffffffff00 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_((ServiceDescriptorProto *)0x5025d7);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (Operation)in_stack_fffffffffffffef8,(char *)0x5025f7);
    _internal_name_abi_cxx11_((ServiceDescriptorProto *)0x50260b);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (in_RSI,uVar2,(string *)CONCAT44(uVar5,in_stack_ffffffffffffff20),
                        (uint8 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  uVar4 = 0;
  uVar1 = _internal_method_size((ServiceDescriptorProto *)0x502639);
  for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    _internal_method((ServiceDescriptorProto *)in_stack_ffffffffffffff00,
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    uVar2 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,(uint8 *)in_RSI);
    uVar2 = MethodDescriptorProto::GetCachedSize((MethodDescriptorProto *)0x502713);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = (EpsCopyOutputStream *)
             MethodDescriptorProto::InternalSerializeWithCachedSizesToArray
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
  }
  if ((uVar5 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    _Internal::options((ServiceDescriptorProto *)in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,(uint8 *)in_RSI);
    uVar2 = ServiceOptions::GetCachedSize((ServiceOptions *)0x502830);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = (EpsCopyOutputStream *)
             ServiceOptions::InternalSerializeWithCachedSizesToArray
                       ((ServiceOptions *)CONCAT44(uVar5,uVar4),
                        (uint8 *)CONCAT44(uVar1,in_stack_ffffffffffffff18),in_RDI);
  }
  if (((uint)(((InternalMetadataWithArena *)&in_RDI->buffer_end_)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->buffer_end_;
    pIVar6 = (InternalMetadataWithArena *)stream_00;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      target_00 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  ::
                  PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                              *)stream_00);
    }
    else {
      target_00 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = (EpsCopyOutputStream *)
             internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)pIVar6,(uint8 *)target_00,stream_00);
  }
  return (uint8 *)in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.ServiceDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_method_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_method(i), target, stream);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceDescriptorProto)
  return target;
}